

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer prVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  iterator iVar9;
  flat_hash_set<long,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  used;
  long local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  undefined1 local_80 [48];
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_100.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_100.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  lVar6 = **(long **)this;
  local_108 = __return_storage_ptr__;
  if (0 < *(int *)(lVar6 + 4)) {
    lVar8 = 4;
    lVar7 = 0;
    do {
      local_b0.piece_._M_len =
           CONCAT44(local_b0.piece_._M_len._4_4_,*(undefined4 *)(*(long *)(lVar6 + 0x38) + lVar8));
      local_e0.piece_._M_len = (size_t)&local_100;
      lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,absl::lts_20240722::hash_internal::Hash<long>,std::equal_to<long>,std::allocator<long>>
      ::EmplaceDecomposable::operator()
                ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
                  *)local_80,&local_e0,(int *)&local_b0,(int *)&local_b0);
      lVar7 = lVar7 + 1;
      lVar6 = **(long **)this;
      lVar8 = lVar8 + 0x30;
    } while (lVar7 < *(int *)(lVar6 + 4));
  }
  local_110 = (long)*(int *)(**(long **)(this + 8) + 4);
  do {
    local_110 = local_110 + 1;
    iVar9 = lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
            ::find<long>(&local_100,&local_110);
  } while (iVar9.ctrl_ != (ctrl_t *)0x0);
  uVar2 = *(undefined8 *)(*(long *)(**(long **)(this + 8) + 8) + 0x20);
  uVar3 = *(undefined8 *)(*(long *)(**(long **)(this + 8) + 8) + 0x28);
  prVar5 = lts_20240722::container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator->(*(iterator **)(this + 0x10));
  pbVar4 = local_108;
  local_48 = (prVar5->second)._M_dataplus._M_p;
  local_50 = (prVar5->second)._M_string_length;
  local_80._0_8_ = (ctrl_t *)0x1;
  local_80._8_8_ = "\"";
  local_80[0x20] = '\x1f';
  local_80[0x21] = '\0';
  local_80[0x22] = '\0';
  local_80[0x23] = '\0';
  local_80[0x24] = '\0';
  local_80[0x25] = '\0';
  local_80[0x26] = '\0';
  local_80[0x27] = '\0';
  local_80._40_8_ = "\" uses the same enum value as \"";
  local_40 = 0x50;
  local_38 = "\". If this is intended, set \'option allow_alias = true;\' to the enum definition.";
  local_80._16_8_ = uVar3;
  local_80._24_8_ = uVar2;
  absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_108,local_80,5);
  if (local_110 < 0x7fffffff) {
    local_80._0_8_ = (ctrl_t *)0x22;
    local_80._8_8_ = " The next available enum value is ";
    pcVar1 = local_e0.digits_;
    lVar6 = absl::lts_20240722::numbers_internal::FastIntToBuffer(local_110,pcVar1);
    local_e0.piece_._M_len = lVar6 - (long)pcVar1;
    local_b0.piece_._M_len = 1;
    local_b0.piece_._M_str = ".";
    local_e0.piece_._M_str = pcVar1;
    absl::lts_20240722::StrAppend((string *)pbVar4,(AlphaNum *)local_80,&local_e0,&local_b0);
  }
  lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  ::~raw_hash_set(&local_100);
  return pbVar4;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}